

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_flush(Curl_easy *data)

{
  size_t blen;
  CURLcode result;
  size_t len;
  size_t bytes_written;
  smb_conn *smbc;
  connectdata *conn;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)data->conn;
  bytes_written = (size_t)&((connectdata *)smbc)->proto;
  blen = (((connectdata *)smbc)->proto).ftpc.pp.sendbuf.leng -
         (((connectdata *)smbc)->proto).ftpc.pp.sendbuf.allc;
  if ((((connectdata *)smbc)->proto).ftpc.pp.sendbuf.leng == 0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    conn = (connectdata *)data;
    data_local._4_4_ =
         Curl_xfer_send(data,(((connectdata *)smbc)->proto).smbc.send_buf +
                             (((connectdata *)smbc)->proto).ftpc.pp.sendbuf.allc,blen,false,&len);
    if (data_local._4_4_ == CURLE_OK) {
      if (len == blen) {
        *(undefined8 *)(bytes_written + 0x48) = 0;
      }
      else {
        *(size_t *)(bytes_written + 0x50) = len + *(long *)(bytes_written + 0x50);
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_flush(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  size_t bytes_written;
  size_t len = smbc->send_size - smbc->sent;
  CURLcode result;

  if(!smbc->send_size)
    return CURLE_OK;

  result = Curl_xfer_send(data, smbc->send_buf + smbc->sent, len, FALSE,
                          &bytes_written);
  if(result)
    return result;

  if(bytes_written != len)
    smbc->sent += bytes_written;
  else
    smbc->send_size = 0;

  return CURLE_OK;
}